

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::udp_tracker_connection::start_announce(udp_tracker_connection *this)

{
  bool bVar1;
  pointer ppVar2;
  tracker_request *ptVar3;
  bitfield_flag local_69;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_68;
  _Self local_60 [3];
  address local_48;
  _Self local_28;
  iterator cc;
  unique_lock<std::mutex> l;
  udp_tracker_connection *this_local;
  
  ::std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&cc,(mutex_type *)m_cache_mutex);
  boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::address(&local_48,&this->m_target);
  local_28._M_node =
       (_Base_ptr)
       ::std::
       map<boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry,_std::less<boost::asio::ip::address>,_std::allocator<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>_>
       ::find((map<boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry,_std::less<boost::asio::ip::address>,_std::allocator<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>_>
               *)m_connection_cache,&local_48);
  local_60[0]._M_node =
       (_Base_ptr)
       ::std::
       map<boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry,_std::less<boost::asio::ip::address>,_std::allocator<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>_>
       ::end((map<boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry,_std::less<boost::asio::ip::address>,_std::allocator<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>_>
              *)m_connection_cache);
  bVar1 = ::std::operator!=(&local_28,local_60);
  if (bVar1) {
    local_68.__d.__r = (duration)time_now();
    ppVar2 = ::std::
             _Rb_tree_iterator<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>
             ::operator->(&local_28);
    bVar1 = ::std::chrono::operator<(&local_68,&(ppVar2->second).expires);
    if (bVar1) {
      ptVar3 = tracker_connection::tracker_req(&this->super_tracker_connection);
      local_69 = (bitfield_flag)
                 libtorrent::flags::operator&
                           ((bitfield_flag<unsigned_char,_libtorrent::aux::tracker_request_flags_tag,_void>
                             )(ptVar3->kind).m_val,
                            (bitfield_flag<unsigned_char,_libtorrent::aux::tracker_request_flags_tag,_void>
                             )0x1);
      bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_69);
      if (bVar1) {
        send_udp_scrape(this);
      }
      else {
        send_udp_announce(this);
      }
      goto LAB_007720c0;
    }
    ::std::
    map<boost::asio::ip::address,libtorrent::aux::udp_tracker_connection::connection_cache_entry,std::less<boost::asio::ip::address>,std::allocator<std::pair<boost::asio::ip::address_const,libtorrent::aux::udp_tracker_connection::connection_cache_entry>>>
    ::erase_abi_cxx11_((map<boost::asio::ip::address,libtorrent::aux::udp_tracker_connection::connection_cache_entry,std::less<boost::asio::ip::address>,std::allocator<std::pair<boost::asio::ip::address_const,libtorrent::aux::udp_tracker_connection::connection_cache_entry>>>
                        *)m_connection_cache,(iterator)local_28._M_node);
  }
  ::std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&cc);
  send_udp_connect(this);
LAB_007720c0:
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&cc);
  return;
}

Assistant:

void udp_tracker_connection::start_announce()
	{
		std::unique_lock<std::mutex> l(m_cache_mutex);
		auto const cc = m_connection_cache.find(m_target.address());
		if (cc != m_connection_cache.end())
		{
			// we found a cached entry! Now, we can only
			// use if if it hasn't expired
			if (aux::time_now() < cc->second.expires)
			{
				if (tracker_req().kind & tracker_request::scrape_request)
					send_udp_scrape();
				else
					send_udp_announce();
				return;
			}
			// if it expired, remove it from the cache
			m_connection_cache.erase(cc);
		}
		l.unlock();

		send_udp_connect();
	}